

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer.h
# Opt level: O3

void __thiscall
mp::ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>::
Parenthesizer::Parenthesizer
          (Parenthesizer *this,
          ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>
          *w,Expr e,int prec)

{
  int iVar1;
  Buffer<char> *pBVar2;
  Precedence PVar3;
  size_t sVar4;
  
  this->writer_ = w;
  this->write_paren_ = false;
  iVar1 = w->precedence_;
  this->saved_precedence_ = iVar1;
  if (prec == -1) {
    prec = iVar1;
  }
  PVar3 = mp::expr::precedence(*(Kind *)e.super_ExprBase.impl_);
  this->write_paren_ = (int)PVar3 < prec;
  if ((int)PVar3 < prec) {
    pBVar2 = w->writer_->buffer_;
    sVar4 = pBVar2->size_;
    if (sVar4 == pBVar2->capacity_) {
      (**pBVar2->_vptr_Buffer)(pBVar2,sVar4 + 1);
      sVar4 = pBVar2->size_;
    }
    pBVar2->size_ = sVar4 + 1;
    pBVar2->ptr_[sVar4] = '(';
  }
  PVar3 = mp::expr::precedence(*(Kind *)e.super_ExprBase.impl_);
  w->precedence_ = PVar3;
  return;
}

Assistant:

ExprWriter<ExprTypes, VarNamer>::Parenthesizer::Parenthesizer(
    ExprWriter<ExprTypes, VarNamer> &w, Expr e, int prec)
: writer_(w), write_paren_(false) {
  saved_precedence_ = w.precedence_;
  if (prec == -1)
    prec = w.precedence_;
  write_paren_ = precedence(e) < prec;
  if (write_paren_)
    w.writer_ << '(';
  w.precedence_ = precedence(e);
}